

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_32f1a0::Db::parseTemplateArgs(Db *this,bool TagTemplates)

{
  bool bVar1;
  Kind KVar2;
  TemplateArgs *pTVar3;
  NodeArray local_c0;
  Node *local_b0;
  Node *Arg_1;
  ParameterPack *local_98;
  Node *TableEntry;
  ParameterPack *local_88;
  Node *Arg;
  type OldParams;
  size_t ArgsBegin;
  bool TagTemplates_local;
  Db *this_local;
  
  bVar1 = consumeIf(this,'I');
  if (bVar1) {
    if (TagTemplates) {
      PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::clear(&this->TemplateParams);
    }
    OldParams.Inline[7] =
         (Node *)PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
    do {
      while( true ) {
        bVar1 = consumeIf(this,'E');
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_c0 = popTrailingNodeArray(this,(size_t)OldParams.Inline[7]);
          pTVar3 = (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::TemplateArgs,(anonymous_namespace)::NodeArray>
                             ((Db *)this,&local_c0);
          return &pTVar3->super_Node;
        }
        if (TagTemplates) break;
        local_b0 = parseTemplateArg(this);
        if (local_b0 == (Node *)0x0) {
          return (Node *)0x0;
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_b0);
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::PODSmallVector
                ((PODSmallVector<(anonymous_namespace)::Node_*,_8UL> *)&Arg,&this->TemplateParams);
      local_88 = (ParameterPack *)parseTemplateArg(this);
      PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::operator=
                (&this->TemplateParams,(PODSmallVector<(anonymous_namespace)::Node_*,_8UL> *)&Arg);
      if (local_88 == (ParameterPack *)0x0) {
        this_local = (Db *)0x0;
        TableEntry._4_4_ = 1;
      }
      else {
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                  (&this->Names,(Node **)&local_88);
        local_98 = local_88;
        KVar2 = Node::getKind(&local_88->super_Node);
        if (KVar2 == KTemplateArgumentPack) {
          _Arg_1 = TemplateArgumentPack::getElements((TemplateArgumentPack *)local_98);
          local_98 = (anonymous_namespace)::Db::
                     make<(anonymous_namespace)::ParameterPack,(anonymous_namespace)::NodeArray>
                               ((Db *)this,(NodeArray *)&Arg_1);
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::push_back
                  (&this->TemplateParams,(Node **)&local_98);
        TableEntry._4_4_ = 0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::~PODSmallVector
                ((PODSmallVector<(anonymous_namespace)::Node_*,_8UL> *)&Arg);
    } while (TableEntry._4_4_ == 0);
  }
  else {
    this_local = (Db *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseTemplateArgs(bool TagTemplates) {
  if (!consumeIf('I'))
    return nullptr;

  // <template-params> refer to the innermost <template-args>. Clear out any
  // outer args that we may have inserted into TemplateParams.
  if (TagTemplates)
    TemplateParams.clear();

  size_t ArgsBegin = Names.size();
  while (!consumeIf('E')) {
    if (TagTemplates) {
      auto OldParams = std::move(TemplateParams);
      Node *Arg = parseTemplateArg();
      TemplateParams = std::move(OldParams);
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
      Node *TableEntry = Arg;
      if (Arg->getKind() == Node::KTemplateArgumentPack) {
        TableEntry = make<ParameterPack>(
            static_cast<TemplateArgumentPack*>(TableEntry)->getElements());
      }
      TemplateParams.push_back(TableEntry);
    } else {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
  }
  return make<TemplateArgs>(popTrailingNodeArray(ArgsBegin));
}